

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  char *__ptr;
  ZSTD_DDictHashSet *__ptr_00;
  ZSTD_DDict **__ptr_01;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    return 0;
  }
  if (dctx->staticSize != 0) {
    return 0xffffffffffffffc0;
  }
  p_Var1 = (dctx->customMem).customFree;
  pvVar2 = (dctx->customMem).opaque;
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  __ptr = dctx->inBuff;
  if (__ptr != (char *)0x0) {
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(__ptr);
    }
    else {
      (*p_Var1)(pvVar2,__ptr);
    }
  }
  dctx->inBuff = (char *)0x0;
  __ptr_00 = dctx->ddictSet;
  if (__ptr_00 == (ZSTD_DDictHashSet *)0x0) goto LAB_007b63f7;
  __ptr_01 = __ptr_00->ddictPtrTable;
  if (__ptr_01 == (ZSTD_DDict **)0x0) {
    if (p_Var1 != (ZSTD_freeFunction)0x0) goto LAB_007b63d1;
LAB_007b63e4:
    free(__ptr_00);
  }
  else {
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(__ptr_01);
      goto LAB_007b63e4;
    }
    (*p_Var1)(pvVar2,__ptr_01);
LAB_007b63d1:
    (*p_Var1)(pvVar2,__ptr_00);
  }
  dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
LAB_007b63f7:
  if (p_Var1 == (ZSTD_freeFunction)0x0) {
    free(dctx);
  }
  else {
    (*p_Var1)(pvVar2,dctx);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}